

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O3

void pnga_print_distribution(int fstyle,Integer g_a)

{
  Integer IVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  char *in_R8;
  ulong uVar7;
  long lVar8;
  long lVar9;
  Integer *dims_00;
  long *plVar10;
  bool bVar11;
  Integer ndim;
  Integer hi [7];
  Integer lo [7];
  Integer index [7];
  Integer nblocks [7];
  char *name;
  Integer type;
  char ctype [128];
  Integer proc_grid [7];
  Integer dims [7];
  char msg [100];
  Integer proc_idx [7];
  ulong local_318;
  int local_30c;
  ulong local_308;
  ulong local_300;
  ulong local_2f8;
  int local_2ec;
  Integer local_2e8 [8];
  Integer local_2a8 [6];
  long alStack_278 [8];
  long alStack_238 [2];
  Integer local_228 [8];
  char *local_1e8;
  Integer local_1e0;
  int local_1d8;
  undefined1 uStack_1d4;
  undefined1 uStack_1d3;
  undefined2 uStack_1d2;
  short local_1d0;
  undefined2 uStack_1ce;
  undefined1 uStack_1cc;
  long local_158 [6];
  Integer aIStack_128 [10];
  char local_d8 [112];
  Integer local_68 [7];
  
  local_30c = fstyle;
  local_308 = g_a;
  local_300 = pnga_nnodes();
  iVar5 = _ga_sync_end;
  bVar11 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar11) {
    pnga_sync();
  }
  IVar1 = pnga_nodeid();
  uVar7 = local_308;
  if (IVar1 != 0) goto LAB_0011d08a;
  dims_00 = aIStack_128 + 2;
  pnga_inquire(local_308,&local_1e0,(Integer *)&local_318,dims_00);
  pnga_inquire_name(uVar7,&local_1e8);
  printf("Array Handle=%d Name:\'%s\' ",uVar7 & 0xffffffff,local_1e8);
  printf("Data Type:");
  switch(local_1e0) {
  case 0x3e9:
    pcVar6 = "integer";
    break;
  case 0x3ea:
    pcVar6 = "long";
    break;
  case 0x3eb:
    pcVar6 = "float";
    break;
  case 0x3ec:
    pcVar6 = "double";
    break;
  default:
    pnga_error("ga_print_distribution: type not supported",local_1e0);
    goto LAB_0011c855;
  case 0x3ee:
    pcVar6 = "float (single) complex";
    break;
  case 0x3ef:
    pcVar6 = "double complex";
    break;
  case 0x3f8:
    pcVar6 = "long long";
  }
  printf(pcVar6);
LAB_0011c855:
  printf("\nArray Dimensions:");
  if (local_30c == 0) {
    if (1 < (long)local_318) {
      uVar7 = local_318 + 1;
      do {
        printf("%ldx",aIStack_128[uVar7]);
        uVar7 = uVar7 - 1;
      } while (2 < uVar7);
    }
  }
  else {
    if ((long)local_318 < 2) {
      lVar8 = local_318 - 1;
    }
    else {
      lVar9 = 0;
      do {
        printf("%ldx",aIStack_128[lVar9 + 2]);
        lVar9 = lVar9 + 1;
        lVar8 = local_318 - 1;
      } while (lVar9 < lVar8);
    }
    dims_00 = aIStack_128 + lVar8 + 2;
  }
  printf("%ld\n",*dims_00);
  pnga_get_distribution_type(local_308,(char *)&local_1d8);
  local_2ec = iVar5;
  if (CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) == 0x72616c75676572)
  {
    if (0 < (long)local_300) {
      uVar7 = 0;
      do {
        pnga_distribution(local_308,uVar7,local_2a8,local_2e8);
        sprintf(local_d8,"Process=%d\t owns array section: ",uVar7 & 0xffffffff);
        if (local_30c == 0) {
          if (1 < (long)local_318) {
            lVar8 = 0;
            uVar4 = local_318;
            do {
              uVar4 = uVar4 - 1;
              IVar1 = local_2a8[lVar8];
              local_2a8[lVar8] = local_2a8[uVar4];
              local_2a8[uVar4] = IVar1;
              IVar1 = local_2e8[lVar8];
              in_R8 = (char *)local_2e8[uVar4];
              local_2e8[lVar8] = (Integer)in_R8;
              local_2e8[uVar4] = IVar1;
              lVar8 = lVar8 + 1;
            } while ((long)local_318 / 2 != lVar8);
          }
          if (0 < (long)local_318) {
            uVar4 = 0;
            do {
              local_2a8[uVar4] = local_2a8[uVar4] + -1;
              uVar4 = uVar4 + 1;
            } while (local_318 != uVar4);
            if (0 < (long)local_318) {
              uVar4 = 0;
              do {
                local_2e8[uVar4] = local_2e8[uVar4] + -1;
                uVar4 = uVar4 + 1;
              } while (local_318 != uVar4);
            }
          }
        }
        gai_print_range(local_d8,(int)local_318,local_2a8,local_2e8,in_R8);
        uVar7 = uVar7 + 1;
      } while (uVar7 != local_300);
    }
  }
  else if (CONCAT17(uStack_1cc,
                    CONCAT25(uStack_1ce,CONCAT23(local_1d0,CONCAT21(uStack_1d2,uStack_1d3)))) ==
           0x63696c6379635f &&
           CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) ==
           0x79635f6b636f6c62) {
    pnga_nblock(local_308,local_228);
    puts("\nDistribution is block-cyclic");
    uVar7 = local_300;
    lVar8 = 1;
    if (0 < (long)local_318) {
      uVar4 = 0;
      do {
        lVar8 = lVar8 * local_228[uVar4];
        uVar4 = uVar4 + 1;
      } while (local_318 != uVar4);
    }
    printf("\nTotal of %ld blocks on %ld processors\n",lVar8,local_300);
    if (0 < (long)uVar7) {
      uVar7 = 0;
      do {
        printf("Distribution on process %ld\n",uVar7);
        uVar4 = uVar7;
        for (; (long)uVar7 < lVar8; uVar7 = uVar7 + local_300) {
          pnga_distribution(local_308,uVar7,local_2a8,local_2e8);
          sprintf(local_d8,"  Block=%d\t corresponds to array section: ",uVar7 & 0xffffffff);
          if (local_30c == 0) {
            if (1 < (long)local_318) {
              lVar9 = 0;
              uVar4 = local_318;
              do {
                uVar4 = uVar4 - 1;
                IVar1 = local_2a8[lVar9];
                local_2a8[lVar9] = local_2a8[uVar4];
                local_2a8[uVar4] = IVar1;
                IVar1 = local_2e8[lVar9];
                in_R8 = (char *)local_2e8[uVar4];
                local_2e8[lVar9] = (Integer)in_R8;
                local_2e8[uVar4] = IVar1;
                lVar9 = lVar9 + 1;
              } while ((long)local_318 / 2 != lVar9);
            }
            if (0 < (long)local_318) {
              uVar4 = 0;
              do {
                local_2a8[uVar4] = local_2a8[uVar4] + -1;
                uVar4 = uVar4 + 1;
              } while (local_318 != uVar4);
              if (0 < (long)local_318) {
                uVar2 = 0;
                do {
                  local_2e8[uVar2] = local_2e8[uVar2] + -1;
                  uVar2 = uVar2 + 1;
                  uVar4 = local_318;
                } while (local_318 != uVar2);
                goto LAB_0011cc68;
              }
            }
            uVar4 = 0;
          }
LAB_0011cc68:
          gai_print_range(local_d8,(int)local_318,local_2a8,local_2e8,in_R8);
        }
        uVar7 = uVar4 + 1;
      } while ((long)uVar7 < (long)local_300);
    }
  }
  else if (((local_1d0 == 0x6b &&
             CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) ==
             0x636170616c616373) ||
           (CONCAT22(uStack_1ce,local_1d0) == 0x676572 &&
            CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) ==
            0x72695f64656c6974)) ||
          (CONCAT11(uStack_1d3,uStack_1d4) == 100 && local_1d8 == 0x656c6974)) {
    pnga_nblock(local_308,local_228);
    if (local_1d0 == 0x6b &&
        CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) ==
        0x636170616c616373) {
      pcVar6 = "\nDistribution is ScaLAPACK";
LAB_0011ccaf:
      puts(pcVar6);
    }
    else {
      if (CONCAT22(uStack_1ce,local_1d0) == 0x676572 &&
          CONCAT26(uStack_1d2,CONCAT15(uStack_1d3,CONCAT14(uStack_1d4,local_1d8))) ==
          0x72695f64656c6974) {
        pcVar6 = "\nDistribution is Tiled Irregular";
        goto LAB_0011ccaf;
      }
      if (CONCAT11(uStack_1d3,uStack_1d4) == 100 && local_1d8 == 0x656c6974) {
        pcVar6 = "\nDistribution is Tiled";
        goto LAB_0011ccaf;
      }
    }
    putchar(10);
    printf("Number of blocks in each dimension: [");
    if ((long)local_318 < 2) {
      lVar8 = local_318 - 1;
    }
    else {
      lVar9 = 0;
      do {
        printf("%ld,",local_228[lVar9]);
        lVar9 = lVar9 + 1;
        lVar8 = local_318 - 1;
      } while (lVar9 < lVar8);
    }
    printf("%ld]\n\n",local_228[lVar8]);
    pnga_get_proc_grid(local_308,local_158);
    printf("Processor grid dimensions: [");
    if ((long)local_318 < 2) {
      lVar8 = local_318 - 1;
    }
    else {
      lVar9 = 0;
      do {
        printf("%ld,",local_158[lVar9]);
        lVar9 = lVar9 + 1;
        lVar8 = local_318 - 1;
      } while (lVar9 < lVar8);
    }
    printf("%ld]\n\n",local_228[lVar8]);
    if (0 < (long)local_300) {
      uVar7 = 0;
      do {
        printf("Distribution on process %ld\n",uVar7);
        uVar4 = local_308;
        pnga_get_proc_index(local_308,uVar7,local_68);
        local_2f8 = uVar7;
        pnga_get_proc_index(uVar4,uVar7,alStack_278 + 2);
        do {
          if ((long)local_318 < 1) {
            IVar1 = 0;
          }
          else {
            uVar7 = local_318 + 1;
            IVar1 = 0;
            do {
              IVar1 = IVar1 * alStack_238[uVar7] + alStack_278[uVar7];
              uVar7 = uVar7 - 1;
            } while (1 < uVar7);
          }
          sprintf(local_d8," idx: %ld Block=[",IVar1);
          pnga_distribution(local_308,IVar1,local_2a8,local_2e8);
          sVar3 = strlen(local_d8);
          uVar7 = local_318 - 1;
          pcVar6 = local_d8 + sVar3;
          if (local_30c == 0) {
            if (1 < (long)local_318) {
              plVar10 = alStack_278 + local_318 + 1;
              do {
                sprintf(pcVar6,"%ld,",*plVar10);
                sVar3 = strlen(pcVar6);
                pcVar6 = pcVar6 + sVar3;
                plVar10 = plVar10 + 1;
              } while( true );
            }
            sprintf(pcVar6,"%ld]",alStack_278[2]);
            sVar3 = strlen(pcVar6);
            sprintf(pcVar6 + sVar3,"\t corresponds to array section: %d ",uVar7 & 0xffffffff);
LAB_0011cf50:
            if (1 < (long)local_318) {
              lVar8 = 0;
              uVar7 = local_318;
              do {
                uVar7 = uVar7 - 1;
                IVar1 = local_2a8[lVar8];
                local_2a8[lVar8] = local_2a8[uVar7];
                local_2a8[uVar7] = IVar1;
                IVar1 = local_2e8[lVar8];
                in_R8 = (char *)local_2e8[uVar7];
                local_2e8[lVar8] = (Integer)in_R8;
                local_2e8[uVar7] = IVar1;
                lVar8 = lVar8 + 1;
              } while ((long)local_318 / 2 != lVar8);
            }
            if (0 < (long)local_318) {
              uVar7 = 0;
              do {
                local_2a8[uVar7] = local_2a8[uVar7] + -1;
                uVar7 = uVar7 + 1;
              } while (local_318 != uVar7);
              if (0 < (long)local_318) {
                uVar7 = 0;
                do {
                  local_2e8[uVar7] = local_2e8[uVar7] + -1;
                  uVar7 = uVar7 + 1;
                } while (local_318 != uVar7);
                local_2f8 = local_318;
                goto LAB_0011cfd4;
              }
            }
            local_2f8 = 0;
          }
          else {
            uVar4 = 0;
            if (1 < (long)local_318) {
              uVar4 = 0;
              do {
                sprintf(pcVar6,"%ld,",alStack_278[uVar4 + 2]);
                sVar3 = strlen(pcVar6);
                pcVar6 = pcVar6 + sVar3;
                uVar4 = uVar4 + 1;
                uVar7 = local_318 - 1;
              } while ((long)uVar4 < (long)uVar7);
            }
            sprintf(pcVar6,"%ld]",alStack_278[uVar7 + 2]);
            sVar3 = strlen(pcVar6);
            sprintf(pcVar6 + sVar3,"\t corresponds to array section: %d ",uVar4 & 0xffffffff);
            if (local_30c == 0) goto LAB_0011cf50;
          }
LAB_0011cfd4:
          gai_print_range(local_d8,(int)local_318,local_2a8,local_2e8,in_R8);
          alStack_278[2] = alStack_278[2] + local_158[0];
          if (0 < (long)local_318) {
            uVar7 = 0;
            do {
              if (local_228[uVar7] <= alStack_278[uVar7 + 2] && (long)uVar7 < (long)(local_318 - 1))
              {
                alStack_278[uVar7 + 2] = local_68[uVar7];
                alStack_278[uVar7 + 3] = alStack_278[uVar7 + 3] + local_158[uVar7 + 1];
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != local_318);
          }
        } while (alStack_278[local_318 + 1] < local_228[local_318 - 1]);
        uVar7 = local_2f8 + 1;
      } while ((long)uVar7 < (long)local_300);
    }
  }
  else {
    puts("\nData distribution type is unknown");
  }
  fflush(_stdout);
  iVar5 = local_2ec;
LAB_0011d08a:
  if (iVar5 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_print_distribution(int fstyle, Integer g_a)
{
Integer ndim, i, proc, type, nproc=pnga_nnodes();
Integer dims[MAXDIM], lo[MAXDIM], hi[MAXDIM];
char msg[100];
char ctype[128];
char *name;
int local_sync_begin,local_sync_end;

    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_sync();

    if(pnga_nodeid() ==0){
      pnga_inquire(g_a, &type, &ndim, dims);
      pnga_inquire_name(g_a, &name);
      printf("Array Handle=%d Name:'%s' ",(int)g_a, name);
      printf("Data Type:");
      switch(type){
        case C_DBL: printf("double"); break;
        case C_INT: printf("integer"); break;
        case C_DCPL: printf("double complex"); break;
        case C_SCPL: printf("float (single) complex"); break;
        case C_FLOAT: printf("float"); break; 
        case C_LONG: printf("long"); break; 
        case C_LONGLONG: printf("long long"); break; 
        default: pnga_error("ga_print_distribution: type not supported",type);
      }
      printf("\nArray Dimensions:");
      if(fstyle){
         for(i=0; i<ndim-1; i++)printf("%ldx",(long)dims[i]);
         printf("%ld\n",(long)dims[ndim-1]);
      }else{
         for(i=ndim-1; i>0; i--)printf("%ldx",(long)dims[i]);
         printf("%ld\n",(long)dims[0]);
      }

      /* print array range for every processor */
      
      pnga_get_distribution_type(g_a, ctype);
      if (!strcmp(ctype,"regular")) {
        for(proc = 0; proc < nproc; proc++){
          pnga_distribution(g_a,proc,lo,hi);
          sprintf(msg,"Process=%d\t owns array section: ",(int)proc);

          /* for C style need to swap and decremenent by 1 both arrays */
          if(!fstyle){
            for(i=0; i<ndim/2; i++){
              swap(lo+i,lo+ndim-i-1); 
              swap(hi+i,hi+ndim-i-1); 
            }
            for(i=0; i<ndim; i++)lo[i]--;
            for(i=0; i<ndim; i++)hi[i]--;
          }
          gai_print_range(msg,(int)ndim,lo,hi,"\n");
        }
      } else if (!strcmp(ctype,"block_cyclic")) {
        Integer nblocks[MAXDIM];
        Integer total, j;
        pnga_nblock(g_a,nblocks);
        printf("\nDistribution is block-cyclic\n");
        total = 1;
        for (i=0; i<ndim; i++) {
          total *= nblocks[i];
        }
        printf("\nTotal of %ld blocks on %ld processors\n",total,nproc);
        for (i=0; i<nproc; i++) {
          printf("Distribution on process %ld\n",i);
          for (j=i; j<total; j += nproc) {
            pnga_distribution(g_a,j,lo,hi);
            sprintf(msg,"  Block=%d\t corresponds to array section: ",(int)j);
            /* for C style need to swap and decremenent by 1 both arrays */
            if(!fstyle){
              for(i=0; i<ndim/2; i++){
                swap(lo+i,lo+ndim-i-1); 
                swap(hi+i,hi+ndim-i-1); 
              }
              for(i=0; i<ndim; i++)lo[i]--;
              for(i=0; i<ndim; i++)hi[i]--;
            }
            gai_print_range(msg,(int)ndim,lo,hi,"\n");
          }
        }
      } else if (!strcmp(ctype,"scalapack") ||
          !strcmp(ctype,"tiled_irreg") || !strcmp(ctype,"tiled")) {
        Integer nblocks[MAXDIM], proc_grid[MAXDIM], proc_idx[MAXDIM];
        Integer index[MAXDIM];
        Integer ok, j, idx;
        pnga_nblock(g_a,nblocks);
        char *ptr;
        if (!strcmp(ctype,"scalapack")) {
          printf("\nDistribution is ScaLAPACK\n");
        } else if (!strcmp(ctype,"tiled_irreg")) {
          printf("\nDistribution is Tiled Irregular\n");
        } else if (!strcmp(ctype,"tiled")) {
          printf("\nDistribution is Tiled\n");
        }

        printf("\n");
        printf("Number of blocks in each dimension: [");
        for (i=0; i<ndim-1; i++) printf("%ld,",nblocks[i]);
        printf("%ld]\n\n",nblocks[ndim-1]);

        pnga_get_proc_grid(g_a,proc_grid);
        printf("Processor grid dimensions: [");
        for (i=0; i<ndim-1; i++) printf("%ld,",proc_grid[i]);
        printf("%ld]\n\n",nblocks[ndim-1]);

        for (i=0; i<nproc; i++) {
          printf("Distribution on process %ld\n",i);
          pnga_get_proc_index(g_a,i,proc_idx);
          pnga_get_proc_index(g_a,i,index);
          ok = 1;
          while (ok) {
            /* find block index */
            idx = 0;
            for (j=ndim-1; j>=0; j--) {
              idx = idx*nblocks[j]+index[j];
            }
            sprintf(msg," idx: %ld Block=[",idx);
            pnga_distribution(g_a,idx,lo,hi);
            ptr = msg + strlen(msg);
            if (fstyle) {
              for (j=0; j<ndim-1; j++) {
                sprintf(ptr,"%ld,",index[j]);
                ptr += strlen(ptr);
              }
              sprintf(ptr,"%ld]",index[ndim-1]);
              ptr += strlen(ptr);
            } else {
              for (j=ndim-1; j>0; j++) {
                sprintf(ptr,"%ld,",index[j]);
                ptr += strlen(ptr);
              }
              sprintf(ptr,"%ld]",index[0]);
              ptr += strlen(ptr);
            }
            sprintf(ptr,"\t corresponds to array section: %d ",(int)j);
            /* for C style need to swap and decremenent by 1 both arrays */
            if(!fstyle){
              for(i=0; i<ndim/2; i++){
                swap(lo+i,lo+ndim-i-1); 
                swap(hi+i,hi+ndim-i-1); 
              }
              for(i=0; i<ndim; i++)lo[i]--;
              for(i=0; i<ndim; i++)hi[i]--;
            }
            gai_print_range(msg,(int)ndim,lo,hi,"\n");
            index[0] += proc_grid[0];
            for (j=0; j<ndim; j++) {
              if (index[j] >= nblocks[j] && j<ndim-1) {
                index[j] = proc_idx[j];
                index[j+1] += proc_grid[j+1];
              }
            }
            if (index[ndim-1] >= nblocks[ndim-1]) ok = 0;
          }
        }
      } else {
        printf("\nData distribution type is unknown\n");
      }
      fflush(stdout);
    }

    if(local_sync_end)pnga_sync();
}